

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

void __thiscall avro::NodeMap::NodeMap(NodeMap *this,SingleLeaf *values)

{
  pointer psVar1;
  pointer psVar2;
  element_type *peVar3;
  sp_counted_base *psVar4;
  NodePrimitive *p;
  undefined8 uVar5;
  NodePtr key;
  shared_ptr<avro::Node> sStack_78;
  MultiAttribute<boost::shared_ptr<avro::Node>_> local_68;
  element_type *local_48;
  sp_counted_base *psStack_40;
  undefined8 local_38;
  shared_count asStack_30 [2];
  
  concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>::MultiAttribute(&local_68,values);
  (this->super_NodeImplMap).super_Node.type_ = AVRO_MAP;
  (this->super_NodeImplMap).super_Node.locked_ = false;
  (this->super_NodeImplMap).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_001808d0;
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  vector(&(this->super_NodeImplMap).leafAttributes_.attrs_,&local_68.attrs_);
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  ~vector(&local_68.attrs_);
  (this->super_NodeImplMap).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00181088;
  p = (NodePrimitive *)operator_new(0x18);
  (p->super_NodeImplPrimitive).super_Node.type_ = AVRO_STRING;
  (p->super_NodeImplPrimitive).super_Node.locked_ = false;
  (p->super_NodeImplPrimitive).super_Node._vptr_Node = (_func_int **)&PTR__Node_00180c78;
  boost::shared_ptr<avro::Node>::shared_ptr<avro::NodePrimitive>(&sStack_78,p);
  (*(this->super_NodeImplMap).super_Node._vptr_Node[0x12])(this,&sStack_78);
  psVar1 = (this->super_NodeImplMap).leafAttributes_.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (this->super_NodeImplMap).leafAttributes_.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 == psVar1) {
    uVar5 = 0;
  }
  else {
    if (1 < (ulong)((long)psVar2 - (long)psVar1 >> 4)) {
      local_48 = psVar1->px;
      psStack_40 = (psVar1->pn).pi_;
      peVar3 = psVar1[1].px;
      psVar4 = psVar1[1].pn.pi_;
      psVar1[1].px = (element_type *)0x0;
      psVar1[1].pn.pi_ = (sp_counted_base *)0x0;
      local_68.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      psVar1->px = peVar3;
      (psVar1->pn).pi_ = psVar4;
      local_68.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_68.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      local_38 = 0;
      asStack_30[0].pi_ = (sp_counted_base *)0x0;
      local_68.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)psVar1[1].px;
      local_68.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)psVar1[1].pn.pi_;
      psVar1[1].px = local_48;
      psVar1[1].pn.pi_ = psStack_40;
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_68.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      boost::detail::shared_count::~shared_count(asStack_30);
      boost::detail::shared_count::~shared_count(&sStack_78.pn);
      return;
    }
    uVar5 = 1;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
}

Assistant:

explicit NodeMap(const SingleLeaf &values) :
        NodeImplMap(AVRO_MAP, NoName(), values, NoLeafNames(), NoSize())
    { 
        // need to add the key for the map too
        NodePtr key(new NodePrimitive(AVRO_STRING));
        doAddLeaf(key);

        // key goes before value
        std::swap(leafAttributes_.get(0), leafAttributes_.get(1));
    }